

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitSIMDShift(BinaryInstWriter *this,SIMDShift *curr)

{
  void *__buf;
  int __fd;
  LEB<unsigned_int,_unsigned_char> local_1c;
  
  local_1c.value._0_1_ = 0xfd;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)&local_1c);
  switch(curr->op) {
  case ShlVecI8x16:
    __fd = (int)this->o;
    local_1c.value = 0x6b;
    break;
  case ShrSVecI8x16:
    __fd = (int)this->o;
    local_1c.value = 0x6c;
    break;
  case ShrUVecI8x16:
    __fd = (int)this->o;
    local_1c.value = 0x6d;
    break;
  case ShlVecI16x8:
    __fd = (int)this->o;
    local_1c.value = 0x8b;
    break;
  case ShrSVecI16x8:
    __fd = (int)this->o;
    local_1c.value = 0x8c;
    break;
  case ShrUVecI16x8:
    __fd = (int)this->o;
    local_1c.value = 0x8d;
    break;
  case ShlVecI32x4:
    __fd = (int)this->o;
    local_1c.value = 0xab;
    break;
  case ShrSVecI32x4:
    __fd = (int)this->o;
    local_1c.value = 0xac;
    break;
  case ShrUVecI32x4:
    __fd = (int)this->o;
    local_1c.value = 0xad;
    break;
  case ShlVecI64x2:
    __fd = (int)this->o;
    local_1c.value = 0xcb;
    break;
  case ShrSVecI64x2:
    __fd = (int)this->o;
    local_1c.value = 0xcc;
    break;
  case ShrUVecI64x2:
    __fd = (int)this->o;
    local_1c.value = 0xcd;
    break;
  default:
    goto switchD_00c983dd_default;
  }
  LEB<unsigned_int,_unsigned_char>::write(&local_1c,__fd,__buf,0xe356cc);
switchD_00c983dd_default:
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDShift(SIMDShift* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix);
  switch (curr->op) {
    case ShlVecI8x16:
      o << U32LEB(BinaryConsts::I8x16Shl);
      break;
    case ShrSVecI8x16:
      o << U32LEB(BinaryConsts::I8x16ShrS);
      break;
    case ShrUVecI8x16:
      o << U32LEB(BinaryConsts::I8x16ShrU);
      break;
    case ShlVecI16x8:
      o << U32LEB(BinaryConsts::I16x8Shl);
      break;
    case ShrSVecI16x8:
      o << U32LEB(BinaryConsts::I16x8ShrS);
      break;
    case ShrUVecI16x8:
      o << U32LEB(BinaryConsts::I16x8ShrU);
      break;
    case ShlVecI32x4:
      o << U32LEB(BinaryConsts::I32x4Shl);
      break;
    case ShrSVecI32x4:
      o << U32LEB(BinaryConsts::I32x4ShrS);
      break;
    case ShrUVecI32x4:
      o << U32LEB(BinaryConsts::I32x4ShrU);
      break;
    case ShlVecI64x2:
      o << U32LEB(BinaryConsts::I64x2Shl);
      break;
    case ShrSVecI64x2:
      o << U32LEB(BinaryConsts::I64x2ShrS);
      break;
    case ShrUVecI64x2:
      o << U32LEB(BinaryConsts::I64x2ShrU);
      break;
  }
}